

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

void __thiscall irr::core::string<char>::string(string<char> *this,double number)

{
  string *in_RDI;
  undefined8 in_XMM0_Qa;
  c8 tmpbuf [32];
  char local_38 [40];
  undefined8 local_10;
  
  local_10 = in_XMM0_Qa;
  ::std::__cxx11::string::string(in_RDI);
  snprintf(local_38,0x20,"%0.6f",local_10);
  ::std::__cxx11::string::operator=(in_RDI,local_38);
  return;
}

Assistant:

explicit string(const double number)
	{
		c8 tmpbuf[32];
		snprintf_irr(tmpbuf, sizeof(tmpbuf), "%0.6f", number);
		str = tmpbuf;
	}